

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ordering.hh
# Opt level: O0

int tchecker::
    lexical_cmp<unsigned_int_const*,unsigned_int_const*,tchecker::lexical_cmp(tchecker::vloc_t_const&,tchecker::vloc_t_const&)::__0>
              (undefined8 *begin1,long *end1,undefined8 *begin2,undefined8 *end2)

{
  int iVar1;
  loc_id_t *plStack_40;
  int cmp_value;
  uint *it2;
  uint *it1;
  uint **end2_local;
  uint **begin2_local;
  uint **end1_local;
  uint **begin1_local;
  
  it2 = (uint *)*begin1;
  plStack_40 = (loc_id_t *)*begin2;
  while( true ) {
    if (it2 == (uint *)*end1) {
      begin1_local._4_4_ = -1;
      if (plStack_40 == (loc_id_t *)*end2) {
        begin1_local._4_4_ = 0;
      }
      return begin1_local._4_4_;
    }
    if (plStack_40 == (loc_id_t *)*end2) {
      return 1;
    }
    iVar1 = lexical_cmp::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)((long)&begin1_local + 3),*it2,*plStack_40);
    if (iVar1 < 0) {
      return -1;
    }
    if (0 < iVar1) break;
    it2 = it2 + 1;
    plStack_40 = plStack_40 + 1;
  }
  return 1;
}

Assistant:

int lexical_cmp(I1 const & begin1, I1 const & end1, I2 const & begin2, I2 const & end2, CMP cmp)
{
  I1 it1 = begin1;
  I2 it2 = begin2;
  for (; 1; ++it1, ++it2) {
    if (it1 == end1)
      return (it2 == end2 ? 0 : -1);
    if (it2 == end2)
      return 1;
    int cmp_value = cmp(*it1, *it2);
    if (cmp_value < 0)
      return -1;
    if (cmp_value > 0)
      return 1;
  }
}